

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

void vkt::wsi::anon_unknown_0::validateSurfaceCapabilities
               (ResultCollector *results,VkSurfaceCapabilitiesKHR *capabilities)

{
  deUint32 dVar1;
  uint uVar2;
  VkSurfaceTransformFlagsKHR VVar3;
  VkSurfaceTransformFlagBitsKHR VVar4;
  VkSurfaceTransformFlagBitsKHR VVar5;
  VkCompositeAlphaFlagsKHR VVar6;
  VkSurfaceCapabilitiesKHR *pVVar7;
  bool bVar8;
  int iVar9;
  bool local_282;
  bool local_26a;
  bool local_252;
  bool local_23a;
  bool local_221;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  VkSurfaceCapabilitiesKHR *local_18;
  VkSurfaceCapabilitiesKHR *capabilities_local;
  ResultCollector *results_local;
  
  dVar1 = capabilities->minImageCount;
  local_18 = capabilities;
  capabilities_local = (VkSurfaceCapabilitiesKHR *)results;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"minImageCount must be larger than 0",&local_39);
  tcu::ResultCollector::check(results,dVar1 != 0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pVVar7 = capabilities_local;
  local_221 = false;
  if ((local_18->minImageExtent).width != 0) {
    local_221 = (local_18->minImageExtent).height != 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"minImageExtent dimensions must be larger than 0",&local_71);
  tcu::ResultCollector::check((ResultCollector *)pVVar7,local_221,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pVVar7 = capabilities_local;
  local_23a = false;
  if ((local_18->maxImageExtent).width != 0) {
    local_23a = (local_18->maxImageExtent).height != 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"maxImageExtent dimensions must be larger than 0",&local_99);
  tcu::ResultCollector::check((ResultCollector *)pVVar7,local_23a,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pVVar7 = capabilities_local;
  local_252 = false;
  if ((local_18->minImageExtent).width <= (local_18->maxImageExtent).width) {
    local_252 = (local_18->minImageExtent).height <= (local_18->maxImageExtent).height;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"maxImageExtent must be larger or equal to minImageExtent",
             &local_c1);
  tcu::ResultCollector::check((ResultCollector *)pVVar7,local_252,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pVVar7 = capabilities_local;
  if (((local_18->currentExtent).width != 0xffffffff) ||
     ((local_18->currentExtent).height != 0xffffffff)) {
    local_26a = false;
    if ((local_18->currentExtent).width != 0) {
      local_26a = (local_18->currentExtent).height != 0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"currentExtent dimensions must be larger than 0",&local_e9);
    tcu::ResultCollector::check((ResultCollector *)pVVar7,local_26a,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    pVVar7 = capabilities_local;
    bVar8 = de::inRange<unsigned_int>
                      ((local_18->currentExtent).width,(local_18->minImageExtent).width,
                       (local_18->maxImageExtent).width);
    local_282 = false;
    if (bVar8) {
      local_282 = de::inRange<unsigned_int>
                            ((local_18->currentExtent).height,(local_18->minImageExtent).height,
                             (local_18->maxImageExtent).height);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"currentExtent is not in supported extent limits",&local_111);
    tcu::ResultCollector::check((ResultCollector *)pVVar7,local_282,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  pVVar7 = capabilities_local;
  dVar1 = local_18->maxImageArrayLayers;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"maxImageArrayLayers must be larger than 0",&local_139);
  tcu::ResultCollector::check((ResultCollector *)pVVar7,dVar1 != 0,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  pVVar7 = capabilities_local;
  uVar2 = local_18->supportedUsageFlags;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,
             "VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT must be set in supportedUsageFlags",&local_161);
  tcu::ResultCollector::check((ResultCollector *)pVVar7,SUB41((uVar2 & 0x10) >> 4,0),&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  pVVar7 = capabilities_local;
  VVar3 = local_18->supportedTransforms;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"At least one transform must be supported",&local_189);
  tcu::ResultCollector::check((ResultCollector *)pVVar7,VVar3 != 0,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  pVVar7 = capabilities_local;
  iVar9 = dePop32(local_18->currentTransform);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Invalid currentTransform",&local_1b1);
  tcu::ResultCollector::check((ResultCollector *)pVVar7,iVar9 != 0,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  pVVar7 = capabilities_local;
  VVar4 = local_18->supportedTransforms;
  VVar5 = local_18->currentTransform;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"currentTransform is not supported by surface",&local_1d9);
  tcu::ResultCollector::check((ResultCollector *)pVVar7,(VVar4 & VVar5) != 0,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  pVVar7 = capabilities_local;
  VVar6 = local_18->supportedCompositeAlpha;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"At least one alpha mode must be supported",&local_201);
  tcu::ResultCollector::check((ResultCollector *)pVVar7,VVar6 != 0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  return;
}

Assistant:

void validateSurfaceCapabilities (tcu::ResultCollector& results, const VkSurfaceCapabilitiesKHR& capabilities)
{
	results.check(capabilities.minImageCount > 0,
				  "minImageCount must be larger than 0");

	results.check(capabilities.minImageExtent.width > 0 &&
				  capabilities.minImageExtent.height > 0,
				  "minImageExtent dimensions must be larger than 0");

	results.check(capabilities.maxImageExtent.width > 0 &&
				  capabilities.maxImageExtent.height > 0,
				  "maxImageExtent dimensions must be larger than 0");

	results.check(capabilities.minImageExtent.width <= capabilities.maxImageExtent.width &&
				  capabilities.minImageExtent.height <= capabilities.maxImageExtent.height,
				  "maxImageExtent must be larger or equal to minImageExtent");

	if (capabilities.currentExtent.width != SURFACE_EXTENT_DETERMINED_BY_SWAPCHAIN_MAGIC ||
		capabilities.currentExtent.height != SURFACE_EXTENT_DETERMINED_BY_SWAPCHAIN_MAGIC)
	{
		results.check(capabilities.currentExtent.width > 0 &&
					  capabilities.currentExtent.height > 0,
					  "currentExtent dimensions must be larger than 0");

		results.check(de::inRange(capabilities.currentExtent.width, capabilities.minImageExtent.width, capabilities.maxImageExtent.width) &&
					  de::inRange(capabilities.currentExtent.height, capabilities.minImageExtent.height, capabilities.maxImageExtent.height),
					  "currentExtent is not in supported extent limits");
	}

	results.check(capabilities.maxImageArrayLayers > 0,
				  "maxImageArrayLayers must be larger than 0");

	results.check((capabilities.supportedUsageFlags & VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT) != 0,
				  "VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT must be set in supportedUsageFlags");

	results.check(capabilities.supportedTransforms != 0,
				  "At least one transform must be supported");

	results.check(dePop32(capabilities.currentTransform) != 0,
				  "Invalid currentTransform");

	results.check((capabilities.supportedTransforms & capabilities.currentTransform) != 0,
				  "currentTransform is not supported by surface");

	results.check(capabilities.supportedCompositeAlpha != 0,
				  "At least one alpha mode must be supported");
}